

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O2

void __thiscall MT32Emu::TVF::startDecay(TVF *this)

{
  Bit8u BVar1;
  Bit8u newIncrement;
  
  if (5 < this->phase) {
    return;
  }
  BVar1 = (this->partialParam->tvf).envTime[4];
  newIncrement = '\x01';
  if (BVar1 != '\0') {
    newIncrement = -BVar1;
  }
  startRamp(this,'\0',newIncrement,6);
  return;
}

Assistant:

void TVF::startDecay() {
	if (phase >= PHASE_RELEASE) {
		return;
	}
	if (partialParam->tvf.envTime[4] == 0) {
		startRamp(0, 1, PHASE_DONE - 1);
	} else {
		startRamp(0, -partialParam->tvf.envTime[4], PHASE_DONE - 1);
	}
}